

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O0

bool __thiscall Js::BigUInt::FAdd(BigUInt *this,BigUInt *pbi)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  uint32 local_30;
  int local_2c;
  int wCarry;
  int32 ilu;
  int32 cluMin;
  int32 cluMax;
  BigUInt *pbi_local;
  BigUInt *this_local;
  
  if (this == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x157,"(this)","this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x158,"(pbi)","pbi");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x159,"(this != pbi)","this != pbi");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ilu = this->m_clu;
  wCarry = pbi->m_clu;
  if (ilu < wCarry) {
    ilu = pbi->m_clu;
    wCarry = this->m_clu;
    if ((this->m_cluMax < ilu) && (bVar2 = FResize(this,ilu + 1), !bVar2)) {
      return false;
    }
  }
  local_30 = 0;
  for (local_2c = 0; local_2c < wCarry; local_2c = local_2c + 1) {
    if (local_30 != 0) {
      local_30 = NumberUtilities::AddLu(this->m_prglu + local_2c,local_30);
    }
    iVar3 = NumberUtilities::AddLu(this->m_prglu + local_2c,pbi->m_prglu[local_2c]);
    local_30 = iVar3 + local_30;
  }
  if (this->m_clu < pbi->m_clu) {
    for (; local_2c < ilu; local_2c = local_2c + 1) {
      this->m_prglu[local_2c] = pbi->m_prglu[local_2c];
      if (local_30 != 0) {
        local_30 = NumberUtilities::AddLu(this->m_prglu + local_2c,local_30);
      }
    }
    this->m_clu = ilu;
  }
  else {
    for (; local_30 != 0 && local_2c < ilu; local_2c = local_2c + 1) {
      local_30 = NumberUtilities::AddLu(this->m_prglu + local_2c,local_30);
    }
  }
  if (local_30 != 0) {
    if ((this->m_cluMax <= this->m_clu) && (bVar2 = FResize(this,this->m_clu + 1), !bVar2)) {
      return false;
    }
    iVar3 = this->m_clu;
    this->m_clu = iVar3 + 1;
    this->m_prglu[iVar3] = local_30;
  }
  if (this == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x186,"(this)","this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AssertValid(this,true);
  return true;
}

Assistant:

bool BigUInt::FAdd(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 cluMax, cluMin;
        int32 ilu;
        int wCarry;

        if ((cluMax = m_clu) < (cluMin = pbi->m_clu))
        {
            cluMax = pbi->m_clu;
            cluMin = m_clu;
            if (cluMax > m_cluMax && !FResize(cluMax + 1))
                return false;
        }

        wCarry = 0;
        for (ilu = 0; ilu < cluMin; ilu++)
        {
            if (0 != wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            wCarry += NumberUtilities::AddLu(&m_prglu[ilu], pbi->m_prglu[ilu]);
        }

        if (m_clu < pbi->m_clu)
        {
            for (; ilu < cluMax; ilu++)
            {
                m_prglu[ilu] = pbi->m_prglu[ilu];
                if (0 != wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            }
            m_clu = cluMax;
        }
        else
        {
            for (; 0 != wCarry && ilu < cluMax; ilu++)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
        }

        if (0 != wCarry)
        {
            if (m_clu >= m_cluMax && !FResize(m_clu + 1))
                return false;
            m_prglu[m_clu++] = wCarry;
        }

        AssertBi(this);
        return true;
    }